

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O2

Vec_Mem_t * If_DeriveHashTable6(int nVars,word uTruth)

{
  byte bVar1;
  word wVar2;
  uint uVar3;
  int iVar4;
  int *__ptr;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  word tCur;
  int *local_60;
  word local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  bVar1 = (byte)nVars & 0x1f;
  local_58 = uTruth;
  uVar3 = Extra_Factorial(nVars);
  __ptr = Extra_GreyCodeSchedule(nVars);
  local_60 = Extra_PermSchedule(nVars);
  iVar4 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    iVar4 = 1;
  }
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar4;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  iVar4 = Abc_PrimeCudd(10000);
  pVVar5 = Vec_IntAlloc(iVar4);
  pVVar5->nSize = iVar4;
  if (pVVar5->pArray != (int *)0x0) {
    memset(pVVar5->pArray,0xff,(long)iVar4 << 2);
  }
  p->vTable = pVVar5;
  pVVar5 = Vec_IntAlloc(10000);
  uVar7 = 0;
  uVar9 = (ulong)(uint)(1 << bVar1);
  if (1 << bVar1 < 1) {
    uVar9 = uVar7;
  }
  uVar6 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar6 = uVar7;
  }
  p->vNexts = pVVar5;
  do {
    if (uVar7 == 2) {
      free(__ptr);
      free(local_60);
      return p;
    }
    tCur = -uVar7 ^ local_58;
    uVar8 = 0;
    local_50 = tCur;
    local_48 = uVar7;
    while (uVar8 != uVar6) {
      local_40 = uVar8;
      local_38 = tCur;
      for (uVar7 = 0; wVar2 = tCur, uVar9 != uVar7; uVar7 = uVar7 + 1) {
        Vec_MemHashInsert(p,&tCur);
        bVar1 = (byte)(1L << ((byte)__ptr[uVar7] & 0x3f));
        tCur = (s_Truths6[__ptr[uVar7]] & wVar2) >> (bVar1 & 0x3f) |
               wVar2 << (bVar1 & 0x3f) & s_Truths6[__ptr[uVar7]];
      }
      if (local_38 != tCur) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                      ,0x171,"Vec_Mem_t *If_DeriveHashTable6(int, word)");
      }
      iVar4 = local_60[local_40];
      bVar1 = (byte)(1L << ((byte)iVar4 & 0x3f));
      tCur = (local_38 & s_PMasks[iVar4][2]) >> (bVar1 & 0x3f) |
             (s_PMasks[iVar4][1] & local_38) << (bVar1 & 0x3f) | s_PMasks[iVar4][0] & local_38;
      uVar8 = local_40 + 1;
    }
    uVar7 = local_48 + 1;
    if (local_50 != tCur) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                    ,0x174,"Vec_Mem_t *If_DeriveHashTable6(int, word)");
    }
  } while( true );
}

Assistant:

Vec_Mem_t * If_DeriveHashTable6( int nVars, word uTruth )
{
    int fVerbose = 0;
    int nMints   = (1 << nVars);
    int nPerms   = Extra_Factorial( nVars );
    int * pComp  = Extra_GreyCodeSchedule( nVars );
    int * pPerm  = Extra_PermSchedule( nVars );
    word Canon   = ABC_CONST(0xFFFFFFFFFFFFFFFF);
    word tCur, tTemp1, tTemp2;
    Vec_Mem_t * vTtMem6 = Vec_MemAllocForTTSimple( nVars );
    int i, p, c;
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                if ( Canon > tCur )
                    Canon = tCur;
                Vec_MemHashInsert( vTtMem6, &tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    ABC_FREE( pComp );
    ABC_FREE( pPerm );
    if ( fVerbose )
    {
/*
        word * pEntry;
        Vec_MemForEachEntry( vTtMem6, pEntry, i )
        {
            Extra_PrintHex( stdout, (unsigned*)pEntry, nVars );  
            printf( ", " );
            if ( i % 4 == 3 )
                printf( "\n" );
        }
*/
        Extra_PrintHex( stdout, (unsigned*)&uTruth, nVars );  printf( "\n" );
        Extra_PrintHex( stdout, (unsigned*)&Canon,  nVars );  printf( "\n" );
        printf( "Members = %d.\n", Vec_MemEntryNum(vTtMem6) );
    }
    return vTtMem6;
}